

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O3

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ostream *poVar1;
  
  printTotals(this,&_testRunStats->totals);
  poVar1 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( _testRunStats.totals );
            stream << "\n" << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }